

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

QSize __thiscall
QFusionStyle::sizeFromContents
          (QFusionStyle *this,ContentsType type,QStyleOption *option,QSize *size,QWidget *widget)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Representation RVar7;
  QSize QVar8;
  qsizetype qVar9;
  QComboBox *this_00;
  Representation RVar10;
  ulong uVar11;
  QStyleOption *pQVar12;
  long in_FS_OFFSET;
  qreal qVar13;
  qreal qVar14;
  qreal qVar15;
  double dVar16;
  double dVar17;
  QFontMetricsF fmBold;
  QFontMetricsF fm;
  undefined1 *local_58;
  undefined1 *local_50;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar8 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,type,option,size,widget);
  uVar11 = (ulong)QVar8 >> 0x20;
  RVar10 = QVar8.ht.m_i;
  RVar7 = QVar8.wd.m_i;
  switch(type) {
  case CT_PushButton:
    if (((option == (QStyleOption *)0x0) || (option->version < 1)) || (option->type != 2)) {
      option = (QStyleOption *)0x0;
    }
    if (option != (QStyleOption *)0x0) {
      iVar4 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                        (this,0,option,0);
      uVar5 = iVar4 + RVar7.m_i;
      uVar6 = 0x50;
      if (0x50 < (int)uVar5) {
        uVar6 = uVar5;
      }
      lVar1._0_4_ = option[1].rect.x2;
      lVar1._4_4_ = option[1].rect.y2;
      if (lVar1 == 0) {
        uVar6 = uVar5;
      }
      QVar8.ht.m_i = 0;
      QVar8.wd.m_i = uVar6;
      cVar2 = QIcon::isNull();
      if (cVar2 == '\0') {
        RVar7.m_i = RVar10.m_i - 2;
        if (*(int *)((long)&option[1].palette.d + 4) < 0x11) {
          RVar7.m_i = RVar10.m_i;
        }
        uVar11 = (ulong)(uint)RVar7.m_i;
      }
    }
    break;
  case CT_CheckBox:
  case CT_RadioButton:
    uVar11 = (ulong)(RVar10.m_i + 1);
    break;
  case CT_ToolButton:
    QVar8.wd.m_i = RVar7.m_i + 2;
    QVar8.ht.m_i = 0;
    uVar11 = (ulong)(RVar10.m_i + 2);
    break;
  case CT_ComboBox:
    QVar8.wd.m_i = RVar7.m_i + 2;
    QVar8.ht.m_i = 0;
  case CT_LineEdit:
switchD_003c0feb_caseD_e:
    uVar11 = (ulong)(RVar10.m_i + 4);
    break;
  case CT_MenuItem:
    if (((option == (QStyleOption *)0x0) || (option->version < 1)) ||
       (pQVar12 = option, option->type != 4)) {
      pQVar12 = (QStyleOption *)0x0;
    }
    if (pQVar12 != (QStyleOption *)0x0) {
      iVar4 = (size->wd).m_i;
      local_48.m_data = (storage_type_conflict *)pQVar12[1].palette.d;
      local_48.m_size = *(qsizetype *)&pQVar12[1].palette.currentGroup;
      qVar9 = QStringView::indexOf(&local_48,(QChar)0x9,0,CaseSensitive);
      if (qVar9 == -1) {
        if (pQVar12[1].version == 1) {
          iVar3 = (int)pQVar12 + 0x60;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_50,(QFont *)&pQVar12[2].state);
          local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QFont::QFont((QFont *)&local_48,(QFont *)&pQVar12[2].state);
          QFont::setWeight((Weight)&local_48);
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_58,(QFont *)&local_48);
          dVar16 = (double)QFontMetricsF::horizontalAdvance((QString *)&local_58,iVar3);
          dVar17 = (double)QFontMetricsF::horizontalAdvance((QString *)&local_50,iVar3);
          dVar16 = ceil(dVar16 - dVar17);
          iVar4 = iVar4 + (int)dVar16;
          QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_58);
          QFont::~QFont((QFont *)&local_48);
          QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_50);
        }
        else if (pQVar12[1].version == 3) {
          qVar13 = QStyleHelper::dpiScaled(6.0,option);
          iVar4 = (int)(qVar13 + qVar13 + (double)iVar4);
        }
      }
      else {
        iVar4 = iVar4 + pQVar12[2].type;
      }
      qVar13 = QStyleHelper::dpi(option);
      qVar14 = QStyleHelper::dpiScaled(12.0,qVar13);
      iVar3 = (int)qVar14;
      if ((int)qVar14 < pQVar12[2].version) {
        iVar3 = pQVar12[2].version;
      }
      qVar14 = QStyleHelper::dpiScaled(25.0,qVar13);
      if (pQVar12[1].version == 2) {
        if (*(long *)&pQVar12[1].palette.currentGroup != 0) {
          uVar6 = QFontMetrics::height();
          uVar11 = (ulong)uVar6;
        }
      }
      else {
        cVar2 = QIcon::isNull();
        if ((cVar2 == '\0') &&
           (this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject),
           this_00 != (QComboBox *)0x0)) {
          QVar8 = QComboBox::iconSize(this_00);
          RVar7.m_i = QVar8.ht.m_i.m_i + 2;
          if (RVar7.m_i <= RVar10.m_i) {
            RVar7.m_i = RVar10.m_i;
          }
          uVar11 = (ulong)(uint)RVar7.m_i;
        }
      }
      qVar15 = QStyleHelper::dpiScaled(12.0,qVar13);
      QVar8.wd.m_i = (int)qVar15 + (int)((double)(iVar4 + iVar3 + 2) + qVar14);
      qVar13 = QStyleHelper::dpiScaled(120.0,qVar13);
      QVar8.ht.m_i = 0;
      if (QVar8.wd.m_i <= (int)qVar13) {
        QVar8.ht.m_i = 0;
        QVar8.wd.m_i = (int)qVar13;
      }
    }
    break;
  case CT_MenuBarItem:
    QVar8.wd.m_i = RVar7.m_i + 8;
    QVar8.ht.m_i = 0;
    uVar11 = (ulong)(RVar10.m_i + 5);
    break;
  case CT_SpinBox:
    uVar11 = (ulong)(RVar10.m_i - 3);
    break;
  case CT_SizeGrip:
    QVar8.wd.m_i = RVar7.m_i + 4;
    QVar8.ht.m_i = 0;
    goto switchD_003c0feb_caseD_e;
  case CT_GroupBox:
    if (option != (QStyleOption *)0x0) {
      iVar3 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                        (this,0x26,option,widget);
      iVar4 = QFontMetrics::height();
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      QVar8.wd.m_i = RVar7.m_i + 10;
      QVar8.ht.m_i = 0;
      uVar11 = (ulong)(RVar10.m_i + iVar4 + 3);
    }
    break;
  case CT_MdiControls:
    QVar8.wd.m_i = RVar7.m_i - 1;
    QVar8.ht.m_i = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)((ulong)QVar8 & 0xffffffff | uVar11 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QFusionStyle::sizeFromContents(ContentsType type, const QStyleOption *option,
                                     const QSize &size, const QWidget *widget) const
{
    QSize newSize = QCommonStyle::sizeFromContents(type, option, size, widget);
    switch (type) {
    case CT_PushButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(option)) {
            const int horizontalMargin = pixelMetric(PM_ButtonMargin, btn);
            newSize += QSize(horizontalMargin, 0);
            if (!btn->text.isEmpty() && newSize.width() < 80)
                newSize.setWidth(80);
            if (!btn->icon.isNull() && btn->iconSize.height() > 16)
                newSize -= QSize(0, 2);
        }
        break;
    case CT_GroupBox:
        if (option) {
            int topMargin = qMax(pixelMetric(PM_IndicatorHeight, option, widget), option->fontMetrics.height()) + groupBoxTopMargin;
            newSize += QSize(10, topMargin); // Add some space below the groupbox
        }
        break;
    case CT_RadioButton:
    case CT_CheckBox:
        newSize += QSize(0, 1);
        break;
    case CT_ToolButton:
        newSize += QSize(2, 2);
        break;
    case CT_SpinBox:
        newSize += QSize(0, -3);
        break;
    case CT_ComboBox:
        newSize += QSize(2, 4);
        break;
    case CT_LineEdit:
        newSize += QSize(0, 4);
        break;
    case CT_MenuBarItem:
        newSize += QSize(8, 5);
        break;
    case CT_MenuItem:
        if (const QStyleOptionMenuItem *menuItem = qstyleoption_cast<const QStyleOptionMenuItem *>(option)) {
            int w = size.width(); // Don't rely of QCommonStyle's width calculation here
            if (menuItem->text.contains(u'\t'))
                w += menuItem->reservedShortcutWidth;
            else if (menuItem->menuItemType == QStyleOptionMenuItem::SubMenu)
                w += 2 * QStyleHelper::dpiScaled(QFusionStylePrivate::menuArrowHMargin, option);
            else if (menuItem->menuItemType == QStyleOptionMenuItem::DefaultItem) {
                const QFontMetricsF fm(menuItem->font);
                QFont fontBold = menuItem->font;
                fontBold.setBold(true);
                const QFontMetricsF fmBold(fontBold);
                w += qCeil(fmBold.horizontalAdvance(menuItem->text) - fm.horizontalAdvance(menuItem->text));
            }
            const qreal dpi = QStyleHelper::dpi(option);
             // Windows always shows a check column
            const int checkcol = qMax<int>(menuItem->maxIconWidth,
                                           QStyleHelper::dpiScaled(QFusionStylePrivate::menuCheckMarkWidth, dpi));
            w += checkcol + windowsItemFrame;
            w += QStyleHelper::dpiScaled(int(QFusionStylePrivate::menuRightBorder) + 10, dpi);
            newSize.setWidth(w);
            if (menuItem->menuItemType == QStyleOptionMenuItem::Separator) {
                if (!menuItem->text.isEmpty()) {
                    newSize.setHeight(menuItem->fontMetrics.height());
                }
            }
            else if (!menuItem->icon.isNull()) {
#if QT_CONFIG(combobox)
                if (const QComboBox *combo = qobject_cast<const QComboBox*>(widget)) {
                    newSize.setHeight(qMax(combo->iconSize().height() + 2, newSize.height()));
                }
#endif
            }
            newSize.setWidth(newSize.width() + int(QStyleHelper::dpiScaled(12, dpi)));
            newSize.setWidth(qMax<int>(newSize.width(), int(QStyleHelper::dpiScaled(120, dpi))));
        }
        break;
    case CT_SizeGrip:
        newSize += QSize(4, 4);
        break;
    case CT_MdiControls:
        newSize -= QSize(1, 0);
        break;
    default:
        break;
    }
    return newSize;
}